

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O0

void pzshape::TPZShapeLinear::Chebyshev(FADREAL *x,int num,TPZVec<Fad<double>_> *phi)

{
  Fad<double> *this;
  TPZVec<Fad<double>_> *in_RDX;
  int in_ESI;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_Fad<double>_>_>
  *in_RDI;
  int ord;
  Fad<double> *in_stack_ffffffffffffff68;
  Fad<double> *in_stack_ffffffffffffff70;
  double *in_stack_ffffffffffffff78;
  Fad<double> *in_stack_ffffffffffffff80;
  Fad<double> *in_stack_ffffffffffffff90;
  Fad<double> *in_stack_ffffffffffffffa0;
  Fad<double> *in_stack_ffffffffffffffa8;
  double in_stack_ffffffffffffffc0;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *in_stack_ffffffffffffffc8;
  undefined4 local_24;
  
  if (0 < in_ESI) {
    TPZVec<Fad<double>_>::operator[](in_RDX,0);
    Fad<double>::operator=<double,_nullptr>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (in_ESI != 1) {
      TPZVec<Fad<double>_>::operator[](in_RDX,1);
      Fad<double>::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      for (local_24 = 2; local_24 < in_ESI; local_24 = local_24 + 1) {
        TPZVec<Fad<double>_>::operator[](in_RDX,(long)(local_24 + -1));
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_double,_nullptr>
                  (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
        this = TPZVec<Fad<double>_>::operator[](in_RDX,(long)(local_24 + -2));
        operator-<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_Fad<double>,_nullptr>
                  ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                    *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        TPZVec<Fad<double>_>::operator[](in_RDX,(long)local_24);
        Fad<double>::operator=(in_stack_ffffffffffffff90,in_RDI);
        FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_Fad<double>_>_>
        ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>,_Fad<double>_>_>
                    *)this);
        FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
        ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>
                  *)this);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)this);
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Chebyshev(FADREAL & x,int num,TPZVec<FADREAL> &phi){
		// Quadratic or higher shape functions
		if(num <= 0) return;
		//phi.Put(0,0,1.0);
		//dphi.Put(0,0, 0.0);
		phi[0] = 1.0; // <!> Remark: the derivatives other than the 0th are set to null
		if(num == 1) return;
		//phi.Put(1,0, x);
		//dphi.Put(0,1, 1.0);
		phi[1] = x;
		//phi[1].fastAccessDx(0)=1.0; // <!> Remark: the derivatives other than the 0th aren't set to null
		//just ensuring the derivatives are properly initialized and that FAD objects of more than
		// one derivative are used
		int ord;
		for(ord = 2;ord<num;ord++) {
			//phi.Put(ord,0, 2.0*x*phi(ord-1,0) - phi(ord-2,0));
			//dphi.Put(0,ord, 2.0*x*dphi(0,ord-1) + 2.0*phi(ord-1,0) - dphi(0,ord-2));
			phi[ord] = x * phi[ord-1] * 2.0 - phi[ord-2];
		}
	}